

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall
ON_BinaryArchive::EnableSave3dmRenderMeshes
          (ON_BinaryArchive *this,uint object_type_flags,bool bSave3dmRenderMeshes)

{
  uint mask;
  bool bSave3dmRenderMeshes_local;
  uint object_type_flags_local;
  ON_BinaryArchive *this_local;
  
  if (bSave3dmRenderMeshes) {
    this->m_save_3dm_render_mesh_flags = object_type_flags | this->m_save_3dm_render_mesh_flags;
  }
  else {
    this->m_save_3dm_render_mesh_flags =
         (object_type_flags ^ 0xffffffff) & this->m_save_3dm_render_mesh_flags;
  }
  return;
}

Assistant:

void ON_BinaryArchive::EnableSave3dmRenderMeshes(
  unsigned int object_type_flags,
  bool bSave3dmRenderMeshes 
  )
{
  if (bSave3dmRenderMeshes)
  {
    // set object type bits
    m_save_3dm_render_mesh_flags |= object_type_flags;
  }
  else
  {
    // clear object type bits
    unsigned int mask = ~object_type_flags;
    m_save_3dm_render_mesh_flags &= mask;
  }
}